

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O1

int lws_http_client_read(lws *wsi,char **buf,int *len)

{
  lws_filepos_t *plVar1;
  char cVar2;
  uint uVar3;
  byte bVar4;
  int buffered;
  int iVar5;
  ulong uVar6;
  size_t len_00;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  bool bVar12;
  lws_tokens eb;
  lws_tokens local_40;
  
  local_40.token = (uchar *)*buf;
  local_40.len = *len;
  buffered = lws_buflist_aware_read
                       (wsi->context->pt + wsi->tsi,wsi,&local_40,'\0',"lws_http_client_read");
  *buf = (char *)local_40.token;
  *len = 0;
  iVar5 = lws_change_pollfd(wsi,0,1);
  iVar11 = -1;
  if (iVar5 == 0) {
    if (buffered < 0) {
      _lws_log(0x10,"%s: SSL capable error\n","lws_http_client_read");
    }
    else if (local_40.len < 1) {
      iVar11 = 0;
    }
    else {
      *len = local_40.len;
      wsi->field_0x2e1 = wsi->field_0x2e1 & 0x7f;
      iVar11 = 0;
      do {
        uVar6 = *(ulong *)&wsi->field_0x2dc;
        bVar12 = (uVar6 & 0x400000000000) == 0;
        if (!bVar12) {
          cVar2 = wsi->chunk_parser;
          while ((cVar2 != '\x02' && (iVar5 = *len, iVar5 != 0))) {
            switch(cVar2) {
            case '\0':
              if (**buf == '\r') {
                wsi->chunk_parser = '\x01';
              }
              else {
                bVar4 = char_to_hex(**buf);
                if ((char)bVar4 < '\0') {
                  pcVar10 = "%s: chunking failure A\n";
                  goto LAB_001284ad;
                }
                wsi->chunk_remaining = wsi->chunk_remaining << 4 | (uint)bVar4;
              }
              break;
            case '\x01':
              if (**buf != '\n') {
                pcVar10 = "%s: chunking failure B\n";
LAB_001284ad:
                iVar11 = 1;
                goto LAB_001284b9;
              }
              if (wsi->chunk_remaining == 0) {
                wsi->chunk_parser = '\x05';
              }
              else {
                wsi->chunk_parser = '\x02';
              }
              break;
            case '\x03':
              if (**buf != '\r') {
                pcVar10 = "%s: chunking failure C\n";
                goto LAB_0012846e;
              }
              wsi->chunk_parser = '\x04';
              break;
            case '\x04':
              if (**buf != '\n') {
                pcVar10 = "%s: chunking failure D\n";
                goto LAB_001284ad;
              }
              wsi->chunk_parser = '\0';
              wsi->chunk_remaining = 0;
              break;
            case '\x05':
              if (**buf != '\r') goto LAB_0012845e;
              wsi->chunk_parser = '\x06';
              break;
            case '\x06':
              if (**buf != '\n') {
LAB_0012845e:
                pcVar10 = "%s: chunking failure F\n";
LAB_0012846e:
                _lws_log(1,pcVar10,"lws_http_client_read");
                lwsl_hexdump_level(1,*buf,(long)*len);
                return -1;
              }
              *buf = *buf + 1;
              *len = iVar5 + -1;
              iVar11 = iVar11 + 1;
              _lws_log(8,"final chunk\n");
              goto LAB_001283a6;
            }
            *buf = *buf + 1;
            *len = *len + -1;
            iVar11 = iVar11 + 1;
            uVar6 = *(ulong *)&wsi->field_0x2dc;
            bVar12 = (uVar6 & 0x400000000000) == 0;
            if (bVar12) goto LAB_00128183;
            cVar2 = wsi->chunk_parser;
          }
          if ((!bVar12) && (wsi->chunk_remaining == 0)) goto LAB_001283f0;
        }
LAB_00128183:
        uVar9 = (wsi->http).rx_content_remain;
        if ((uVar9 == 0) || ((uint)*len <= uVar9)) {
          uVar9 = (ulong)(uint)*len;
        }
        uVar7 = (uint)uVar9;
        uVar8 = uVar7;
        if (!bVar12) {
          uVar3 = wsi->chunk_remaining;
          if ((int)uVar3 < (int)uVar7) {
            uVar8 = uVar3;
          }
          if (uVar3 == 0) {
            uVar8 = uVar7;
          }
        }
        len_00 = (size_t)(int)uVar8;
        if ((uVar6 >> 0x22 & 1) == 0) {
          _lws_log(4,"%s: swallowed read (%d)\n","lws_http_client_read",(ulong)uVar8);
        }
        else {
          iVar5 = user_callback_handle_rxflow
                            (wsi->protocol->callback,wsi,LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
                             wsi->user_space,*buf,len_00);
          if (iVar5 != 0) {
            pcVar10 = "%s: RECEIVE_CLIENT_HTTP_READ returned -1\n";
            iVar11 = 8;
            goto LAB_001284b9;
          }
        }
        *buf = *buf + len_00;
        *len = *len - uVar8;
        uVar6 = *(ulong *)&wsi->field_0x2dc;
        if (((uVar6 & 0x400000000000) != 0) && (wsi->chunk_remaining != 0)) {
          wsi->chunk_remaining = wsi->chunk_remaining - uVar8;
        }
        iVar11 = iVar11 + uVar8;
        if ((uVar6 & 0x400000000000) == 0) goto LAB_00128387;
        if (wsi->chunk_remaining == 0) {
          wsi->chunk_parser = '\x03';
        }
        if ((uVar6 & 0x400000000000) == 0) goto LAB_00128387;
      } while (*len != 0);
      if ((uVar6 & 0x400000000000) == 0) {
LAB_00128387:
        if (((wsi->http).rx_content_length != 0) &&
           (plVar1 = &(wsi->http).rx_content_remain, *plVar1 = *plVar1 - len_00,
           (wsi->http).rx_content_remain == 0)) {
LAB_001283a6:
          iVar5 = lws_http_transaction_completed_client((lws *)0x1283ae);
          if (iVar5 != 0) {
            pcVar10 = "%s: transaction completed says -1\n";
            iVar11 = 4;
LAB_001284b9:
            _lws_log(iVar11,pcVar10,"lws_http_client_read");
            return -1;
          }
        }
      }
LAB_001283f0:
      iVar11 = lws_buflist_aware_finished_consuming
                         (wsi,&local_40,iVar11,buffered,"lws_http_client_read");
      iVar11 = -(uint)(iVar11 != 0);
    }
  }
  return iVar11;
}

Assistant:

int
lws_http_client_read(struct lws *wsi, char **buf, int *len)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	struct lws_tokens eb;
	int buffered, n, consumed = 0;

	/*
	 * If the caller provided a non-NULL *buf and nonzero *len, we should
	 * use that as the buffer for the read action, limititing it to *len
	 * (actual payload will be less if chunked headers inside).
	 *
	 * If it's NULL / 0 length, buflist_aware_read will use the pt_serv_buf
	 */

	eb.token = (unsigned char *)*buf;
	eb.len = *len;

	buffered = lws_buflist_aware_read(pt, wsi, &eb, 0, __func__);
	*buf = (char *)eb.token; /* may be pointing to buflist or pt_serv_buf */
	*len = 0;

	/*
	 * we're taking on responsibility for handling used / unused eb
	 * when we leave, via lws_buflist_aware_finished_consuming()
	 */

//	lwsl_notice("%s: eb.len %d ENTRY chunk remaining %d\n", __func__, eb.len,
//			wsi->chunk_remaining);

	/* allow the source to signal he has data again next time */
	if (lws_change_pollfd(wsi, 0, LWS_POLLIN))
		return -1;

	if (buffered < 0) {
		lwsl_debug("%s: SSL capable error\n", __func__);
		return -1;
	}

	if (eb.len <= 0)
		return 0;

	*len = eb.len;
	wsi->client_rx_avail = 0;

	/*
	 * server may insist on transfer-encoding: chunked,
	 * so http client must deal with it
	 */
spin_chunks:
	//lwsl_notice("%s: len %d SPIN chunk remaining %d\n", __func__, *len,
	//		wsi->chunk_remaining);
	while (wsi->chunked && (wsi->chunk_parser != ELCP_CONTENT) && *len) {
		switch (wsi->chunk_parser) {
		case ELCP_HEX:
			if ((*buf)[0] == '\x0d') {
				wsi->chunk_parser = ELCP_CR;
				break;
			}
			n = char_to_hex((*buf)[0]);
			if (n < 0) {
				lwsl_err("%s: chunking failure A\n", __func__);
				return -1;
			}
			wsi->chunk_remaining <<= 4;
			wsi->chunk_remaining |= n;
			break;
		case ELCP_CR:
			if ((*buf)[0] != '\x0a') {
				lwsl_err("%s: chunking failure B\n", __func__);
				return -1;
			}
			if (wsi->chunk_remaining) {
				wsi->chunk_parser = ELCP_CONTENT;
				//lwsl_notice("starting chunk size %d (block rem %d)\n",
				//		wsi->chunk_remaining, *len);
				break;
			}

			wsi->chunk_parser = ELCP_TRAILER_CR;
			break;

		case ELCP_CONTENT:
			break;

		case ELCP_POST_CR:
			if ((*buf)[0] != '\x0d') {
				lwsl_err("%s: chunking failure C\n", __func__);
				lwsl_hexdump_err(*buf, *len);

				return -1;
			}

			wsi->chunk_parser = ELCP_POST_LF;
			break;

		case ELCP_POST_LF:
			if ((*buf)[0] != '\x0a') {
				lwsl_err("%s: chunking failure D\n", __func__);

				return -1;
			}

			wsi->chunk_parser = ELCP_HEX;
			wsi->chunk_remaining = 0;
			break;

		case ELCP_TRAILER_CR:
			if ((*buf)[0] != '\x0d') {
				lwsl_err("%s: chunking failure F\n", __func__);
				lwsl_hexdump_err(*buf, *len);

				return -1;
			}

			wsi->chunk_parser = ELCP_TRAILER_LF;
			break;

		case ELCP_TRAILER_LF:
			if ((*buf)[0] != '\x0a') {
				lwsl_err("%s: chunking failure F\n", __func__);
				lwsl_hexdump_err(*buf, *len);

				return -1;
			}

			(*buf)++;
			(*len)--;
			consumed++;

			lwsl_info("final chunk\n");
			goto completed;
		}
		(*buf)++;
		(*len)--;
		consumed++;
	}

	if (wsi->chunked && !wsi->chunk_remaining)
		goto account_and_ret;

	if (wsi->http.rx_content_remain &&
	    wsi->http.rx_content_remain < (unsigned int)*len)
		n = (int)wsi->http.rx_content_remain;
	else
		n = *len;

	if (wsi->chunked && wsi->chunk_remaining &&
	    wsi->chunk_remaining < n)
		n = wsi->chunk_remaining;

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_WITH_HUBBUB)
	/* hubbub */
	if (wsi->http.perform_rewrite)
		lws_rewrite_parse(wsi->http.rw, (unsigned char *)*buf, n);
	else
#endif
	{
		if (
#if defined(LWS_WITH_HTTP_PROXY)
		    !wsi->protocol_bind_balance ==
		    !!wsi->http.proxy_clientside
#else
		    !!wsi->protocol_bind_balance
#endif
		  ) {
			if (user_callback_handle_rxflow(wsi->protocol->callback,
				wsi, LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
				wsi->user_space, *buf, n)) {
				lwsl_info("%s: RECEIVE_CLIENT_HTTP_READ returned -1\n",
						__func__);

				return -1;
			}
		}